

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastSet.h
# Opt level: O3

CFastSet<unsigned_int> * __thiscall
CFastSet<unsigned_int>::operator-=(CFastSet<unsigned_int> *this,CFastSet<unsigned_int> *set)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  CSet result;
  CSet b;
  CSet a;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_b0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_80;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_50;
  
  p_Var1 = &local_50._M_impl.super__Rb_tree_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  GetSet(this,(CSet *)&local_50);
  p_Var2 = &local_80._M_impl.super__Rb_tree_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  GetSet(set,(CSet *)&local_80);
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  __set_difference<std::_Rb_tree_const_iterator<unsigned_int>,std::_Rb_tree_const_iterator<unsigned_int>,std::insert_iterator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_50._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1,
             local_80._M_impl.super__Rb_tree_header._M_header._M_left,p_Var2,&local_b0);
  operator=(this,(CSet *)&local_b0);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_b0);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_80);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_50);
  return this;
}

Assistant:

CFastSet<T>& CFastSet<T>::operator-=(const CFastSet& set)
{
	CSet a;
	GetSet( &a );
	CSet b;
	set.GetSet( &b );
	CSet result;

	std::set_difference( a.begin(), a.end(), b.begin(), b.end(),
		std::inserter( result, result.end() ) );

	*this = result;

	return *this;
}